

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O3

bool __thiscall slang::ast::Type::isCovergroup(Type *this)

{
  Type *pTVar1;
  SymbolKind SVar2;
  
  if (this->canonical == (Type *)0x0) {
    this->canonical = this;
    pTVar1 = this;
    do {
      pTVar1 = DeclaredType::getType((DeclaredType *)(pTVar1 + 1));
      this->canonical = pTVar1;
      SVar2 = (pTVar1->super_Symbol).kind;
    } while (SVar2 == TypeAlias);
  }
  else {
    SVar2 = (this->canonical->super_Symbol).kind;
  }
  return SVar2 == CovergroupType;
}

Assistant:

const Type& getCanonicalType() const {
        if (!canonical)
            resolveCanonical();
        return *canonical;
    }